

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkFree(Wlc_Ntk_t *p)

{
  int *piVar1;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *__ptr_00;
  
  if (p->pManName != (Abc_Nam_t *)0x0) {
    Abc_NamStop(p->pManName);
  }
  if (p->pMemFanin != (Mem_Flex_t *)0x0) {
    Mem_FlexStop(p->pMemFanin,0);
  }
  if (p->pMemTable != (Mem_Flex_t *)0x0) {
    Mem_FlexStop(p->pMemTable,0);
  }
  __ptr = p->vTables;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      p->vTables->pArray = (void **)0x0;
      __ptr = p->vTables;
      if (__ptr == (Vec_Ptr_t *)0x0) goto LAB_002b8f77;
    }
    free(__ptr);
    p->vTables = (Vec_Ptr_t *)0x0;
  }
LAB_002b8f77:
  piVar1 = (p->vPis).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vPis).pArray = (int *)0x0;
  }
  piVar1 = (p->vPos).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vPos).pArray = (int *)0x0;
  }
  piVar1 = (p->vCis).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCis).pArray = (int *)0x0;
  }
  piVar1 = (p->vCos).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCos).pArray = (int *)0x0;
  }
  piVar1 = (p->vFfs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vFfs).pArray = (int *)0x0;
  }
  __ptr_00 = p->vInits;
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    if (__ptr_00->pArray != (int *)0x0) {
      free(__ptr_00->pArray);
      p->vInits->pArray = (int *)0x0;
      __ptr_00 = p->vInits;
      if (__ptr_00 == (Vec_Int_t *)0x0) goto LAB_002b900c;
    }
    free(__ptr_00);
    p->vInits = (Vec_Int_t *)0x0;
  }
LAB_002b900c:
  piVar1 = (p->vTravIds).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTravIds).pArray = (int *)0x0;
  }
  piVar1 = (p->vNameIds).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vNameIds).pArray = (int *)0x0;
  }
  piVar1 = (p->vValues).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vValues).pArray = (int *)0x0;
  }
  piVar1 = (p->vCopies).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCopies).pArray = (int *)0x0;
  }
  piVar1 = (p->vBits).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vBits).pArray = (int *)0x0;
  }
  if (p->pInits != (char *)0x0) {
    free(p->pInits);
    p->pInits = (char *)0x0;
  }
  if (p->pObjs != (Wlc_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Wlc_Obj_t *)0x0;
  }
  free(p->pName);
  free(p);
  return;
}

Assistant:

void Wlc_NtkFree( Wlc_Ntk_t * p )
{
    if ( p->pManName )
        Abc_NamStop( p->pManName );
    if ( p->pMemFanin )
        Mem_FlexStop( p->pMemFanin, 0 );
    if ( p->pMemTable )
        Mem_FlexStop( p->pMemTable, 0 );
    Vec_PtrFreeP( &p->vTables );
    ABC_FREE( p->vPis.pArray );
    ABC_FREE( p->vPos.pArray );
    ABC_FREE( p->vCis.pArray );
    ABC_FREE( p->vCos.pArray );
    ABC_FREE( p->vFfs.pArray );
    Vec_IntFreeP( &p->vInits );
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vNameIds.pArray );
    ABC_FREE( p->vValues.pArray );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vBits.pArray );
    ABC_FREE( p->pInits );
    ABC_FREE( p->pObjs );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}